

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatterBase.c
# Opt level: O2

ZyanStatus
ZydisFormatterBaseFormatOperandPTR
          (ZydisFormatter *formatter,ZydisFormatterBuffer *buffer,ZydisFormatterContext *context)

{
  ZyanStatus ZVar1;
  ZyanU8 ZVar2;
  
  if (formatter == (ZydisFormatter *)0x0) {
    __assert_fail("formatter",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/FormatterBase.c"
                  ,0xa7,
                  "ZyanStatus ZydisFormatterBaseFormatOperandPTR(const ZydisFormatter *, ZydisFormatterBuffer *, ZydisFormatterContext *)"
                 );
  }
  if (buffer != (ZydisFormatterBuffer *)0x0) {
    if (context == (ZydisFormatterContext *)0x0) {
      __assert_fail("context",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/FormatterBase.c"
                    ,0xa9,
                    "ZyanStatus ZydisFormatterBaseFormatOperandPTR(const ZydisFormatter *, ZydisFormatterBuffer *, ZydisFormatterContext *)"
                   );
    }
    if ((buffer->is_token_list == '\0') ||
       (ZVar1 = ZydisFormatterBufferAppend(buffer,'\v'), -1 < (int)ZVar1)) {
      if (formatter->addr_base == ZYDIS_NUMERIC_BASE_HEX) {
        ZVar1 = ZydisStringAppendHexU
                          (&buffer->string,(ulong)(context->operand->field_10).ptr.segment,'\x04',
                           formatter->hex_force_leading_number,formatter->hex_uppercase,
                           formatter->number_format[1][0].string,
                           formatter->number_format[1][1].string);
      }
      else {
        if (formatter->addr_base != ZYDIS_NUMERIC_BASE_DEC) {
          return 0x80100004;
        }
        ZVar1 = ZydisStringAppendDecU
                          (&buffer->string,(ulong)(context->operand->field_10).ptr.segment,'\x04',
                           formatter->number_format[0][0].string,
                           formatter->number_format[0][1].string);
      }
      if (-1 < (int)ZVar1) {
        if (buffer->is_token_list == '\0') {
          ZVar1 = ZydisStringAppendShort(&buffer->string,&STR_DELIM_SEGMENT);
        }
        else {
          ZVar1 = ZydisFormatterBufferAppendPredefined
                            (buffer,(ZydisPredefinedToken *)&TOK_DATA_DELIM_SEGMENT);
        }
        if (-1 < (int)ZVar1) {
          ZVar2 = context->instruction->operand_width;
          if (ZVar2 == '\x10') {
            ZVar2 = '\x04';
          }
          else {
            if (ZVar2 != ' ') {
              return 0x80100004;
            }
            ZVar2 = '\b';
          }
          if ((buffer->is_token_list == '\0') ||
             (ZVar1 = ZydisFormatterBufferAppend(buffer,'\v'), -1 < (int)ZVar1)) {
            if (formatter->addr_base == ZYDIS_NUMERIC_BASE_HEX) {
              ZVar1 = ZydisStringAppendHexU
                                (&buffer->string,(ulong)(context->operand->field_10).mem.segment,
                                 ZVar2,formatter->hex_force_leading_number,formatter->hex_uppercase,
                                 formatter->number_format[1][0].string,
                                 formatter->number_format[1][1].string);
            }
            else {
              if (formatter->addr_base != ZYDIS_NUMERIC_BASE_DEC) {
                return 0x80100004;
              }
              ZVar1 = ZydisStringAppendDecU
                                (&buffer->string,(ulong)(context->operand->field_10).mem.segment,
                                 ZVar2,formatter->number_format[0][0].string,
                                 formatter->number_format[0][1].string);
            }
            if (-1 < (int)ZVar1) {
              ZVar1 = 0x100000;
            }
          }
        }
      }
    }
    return ZVar1;
  }
  __assert_fail("buffer",
                "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/FormatterBase.c"
                ,0xa8,
                "ZyanStatus ZydisFormatterBaseFormatOperandPTR(const ZydisFormatter *, ZydisFormatterBuffer *, ZydisFormatterContext *)"
               );
}

Assistant:

ZyanStatus ZydisFormatterBaseFormatOperandPTR(const ZydisFormatter* formatter,
    ZydisFormatterBuffer* buffer, ZydisFormatterContext* context)
{
    ZYAN_ASSERT(formatter);
    ZYAN_ASSERT(buffer);
    ZYAN_ASSERT(context);

    ZYDIS_BUFFER_APPEND_TOKEN(buffer, ZYDIS_TOKEN_IMMEDIATE);
    ZYDIS_STRING_APPEND_NUM_U(formatter, formatter->addr_base, &buffer->string,
        context->operand->ptr.segment, 4, formatter->hex_force_leading_number);
    ZYDIS_BUFFER_APPEND(buffer, DELIM_SEGMENT);

    ZyanU8 padding;
    switch (context->instruction->operand_width)
    {
    case 16:
        padding = 4;
        break;
    case 32:
        padding = 8;
        break;
    default:
        return ZYAN_STATUS_INVALID_ARGUMENT;
    }

    ZYDIS_BUFFER_APPEND_TOKEN(buffer, ZYDIS_TOKEN_IMMEDIATE);
    ZYDIS_STRING_APPEND_NUM_U(formatter, formatter->addr_base, &buffer->string,
        context->operand->ptr.offset , padding, formatter->hex_force_leading_number);

    return ZYAN_STATUS_SUCCESS;
}